

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printUsage(void)

{
  fputs("Usage: rgbgfx [-r stride] [-CmOuVZ] [-v [-v ...]] [-a <attr_map> | -A]\n       [-b <base_ids>] [-c <colors>] [-d <depth>] [-L <slice>] [-N <nb_tiles>]\n       [-n <nb_pals>] [-o <out_file>] [-p <pal_file> | -P] [-q <pal_map> | -Q]\n       [-s <nb_colors>] [-t <tile_map> | -T] [-x <nb_tiles>] <file>\nUseful options:\n    -m, --mirror-tiles    optimize out mirrored tiles\n    -o, --output <path>   output the tile data to this path\n    -t, --tilemap <path>  output the tile map to this path\n    -u, --unique-tiles    optimize out identical tiles\n    -V, --version         print RGBGFX version and exit\n\nFor help, use `man rgbgfx\' or go to https://rgbds.gbdev.io/docs/\n"
        ,_stderr);
  return;
}

Assistant:

static void printUsage(void) {
	fputs("Usage: rgbgfx [-r stride] [-CmOuVZ] [-v [-v ...]] [-a <attr_map> | -A]\n"
	      "       [-b <base_ids>] [-c <colors>] [-d <depth>] [-L <slice>] [-N <nb_tiles>]\n"
	      "       [-n <nb_pals>] [-o <out_file>] [-p <pal_file> | -P] [-q <pal_map> | -Q]\n"
	      "       [-s <nb_colors>] [-t <tile_map> | -T] [-x <nb_tiles>] <file>\n"
	      "Useful options:\n"
	      "    -m, --mirror-tiles    optimize out mirrored tiles\n"
	      "    -o, --output <path>   output the tile data to this path\n"
	      "    -t, --tilemap <path>  output the tile map to this path\n"
	      "    -u, --unique-tiles    optimize out identical tiles\n"
	      "    -V, --version         print RGBGFX version and exit\n"
	      "\n"
	      "For help, use `man rgbgfx' or go to https://rgbds.gbdev.io/docs/\n",
	      stderr);
}